

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlockfile_unix.cpp
# Opt level: O3

void __thiscall QLockFile::unlock(QLockFile *this)

{
  QLockFilePrivate *__filename;
  undefined8 uVar1;
  int iVar2;
  storage_type *in_RCX;
  char16_t *begin;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QByteArrayView ba_00;
  undefined1 local_38 [32];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  __filename = (this->d_ptr).d;
  if (__filename->isLocked == true) {
    close(__filename->fileHandle);
    __filename->fileHandle = -1;
    iVar2 = QFile::remove((char *)__filename);
    if ((char)iVar2 == '\0') {
      QMessageLogger::warning((QMessageLogger *)local_38);
      uVar1 = local_38._0_8_;
      ba.m_data = in_RCX;
      ba.m_size = (qsizetype)"Could not remove our own lock file";
      QString::fromUtf8((QString *)(local_38 + 8),(QString *)0x22,ba);
      ::QTextStream::operator<<((QTextStream *)uVar1,(QString *)(local_38 + 8));
      if ((QArrayData *)local_38._8_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_38._8_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_38._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_38._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_38._8_8_,2,0x10);
        }
      }
      if (*(bool *)(local_38._0_8_ + 0x30) == true) {
        ::QTextStream::operator<<((QTextStream *)local_38._0_8_,' ');
      }
      begin = (__filename->fileName).d.ptr;
      if ((QChar *)begin == (QChar *)0x0) {
        begin = &QString::_empty;
      }
      QDebug::putString((QDebug *)local_38,(QChar *)begin,(__filename->fileName).d.size);
      if (*(bool *)(local_38._0_8_ + 0x30) == true) {
        ::QTextStream::operator<<((QTextStream *)local_38._0_8_,' ');
      }
      uVar1 = local_38._0_8_;
      ba_00.m_data = in_RCX;
      ba_00.m_size = (qsizetype)"maybe permissions changed meanwhile?";
      QString::fromUtf8((QString *)(local_38 + 8),(QString *)0x24,ba_00);
      ::QTextStream::operator<<((QTextStream *)uVar1,(QString *)(local_38 + 8));
      if ((QArrayData *)local_38._8_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_38._8_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_38._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_38._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_38._8_8_,2,0x10);
        }
      }
      if (*(bool *)(local_38._0_8_ + 0x30) == true) {
        ::QTextStream::operator<<((QTextStream *)local_38._0_8_,' ');
      }
      QDebug::~QDebug((QDebug *)local_38);
    }
    __filename->lockError = NoError;
    __filename->isLocked = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLockFile::unlock()
{
    Q_D(QLockFile);
    if (!d->isLocked)
        return;
    close(d->fileHandle);
    d->fileHandle = -1;
    if (!QFile::remove(d->fileName)) {
        qWarning() << "Could not remove our own lock file" << d->fileName << "maybe permissions changed meanwhile?";
        // This is bad because other users of this lock file will now have to wait for the stale-lock-timeout...
    }
    d->lockError = QLockFile::NoError;
    d->isLocked = false;
}